

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O1

bool __thiscall MouseButtonState::Update(MouseButtonState *this,MEVENT *rawEvent)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar1 = rawEvent->bstate;
  iVar2 = rawEvent->x;
  iVar3 = rawEvent->y;
  lVar5 = std::chrono::_V2::system_clock::now();
  if ((uVar1 & 0xc63) == 0) {
    this->button = 0;
    this->state = 0;
    this->time = 0;
    this->lastX = -1;
    this->lastY = -1;
    this->wasDown = false;
    this->clicked = false;
    this->doubleClicked = false;
    return false;
  }
  uVar8 = 2;
  if ((uVar1 & 0x60) == 0) {
    uVar8 = (uint)((uVar1 & 3) != 0);
  }
  uVar7 = 3;
  if ((uVar1 & 0xc00) == 0) {
    uVar7 = uVar8;
  }
  lVar6 = lVar5 / 1000000 - this->time;
  if (((lVar6 < 0x12d) && (-1 < this->lastX)) && (-1 < this->lastY)) {
    uVar9 = iVar2 - this->lastX;
    uVar8 = -uVar9;
    if (0 < (int)uVar9) {
      uVar8 = uVar9;
    }
    if (uVar8 < 3) {
      uVar9 = iVar3 - this->lastY;
      uVar8 = -uVar9;
      if (0 < (int)uVar9) {
        uVar8 = uVar9;
      }
      if (uVar8 < 3) goto LAB_00156eeb;
    }
    this->button = 0;
    this->state = 0;
    this->time = 0;
    this->lastX = -1;
    this->lastY = -1;
    this->wasDown = false;
    this->clicked = false;
    this->doubleClicked = false;
  }
LAB_00156eeb:
  if ((300 < lVar6) || (uVar7 != this->button)) {
    this->button = 0;
    this->state = 0;
    this->time = 0;
    this->lastX = -1;
    this->lastY = -1;
    this->wasDown = false;
    this->clicked = false;
    this->doubleClicked = false;
  }
  if ((uVar1 & 0x842) == 0) {
    if ((this->clicked == false) || (this->wasDown != true)) {
      bVar4 = false;
      goto LAB_00156f64;
    }
    this->doubleClicked = true;
    bVar4 = true;
  }
  else {
    bVar4 = true;
    if (this->clicked == false) {
      this->clicked = true;
      bVar4 = false;
    }
  }
  this->wasDown = bVar4;
  bVar4 = true;
LAB_00156f64:
  this->button = uVar7;
  this->time = lVar5 / 1000000;
  this->lastX = iVar2;
  this->lastY = iVar3;
  return bVar4;
}

Assistant:

bool Update(const MEVENT& rawEvent) {
        const mmask_t state = rawEvent.bstate;
        const int x = rawEvent.x;
        const int y = rawEvent.y;
        bool result = false;
        const int64_t newTime = App::Now();

        /* ugh... */
        const bool isDown = state & BUTTON1_PRESSED || state & BUTTON2_PRESSED || state & BUTTON3_PRESSED;
        const bool isUp = state & BUTTON1_RELEASED || state & BUTTON2_RELEASED || state & BUTTON3_RELEASED;

        if (!isDown && !isUp) {
            /* if both of these were false we got an unexpected mouse event. let's
            go ahead and reset our state and return */
            Reset();
            return false;
        }

        int newButton = 0;

        if (state & BUTTON1_PRESSED || state & BUTTON1_RELEASED) {
            newButton = 1;
        }
        if (state & BUTTON2_PRESSED || state & BUTTON2_RELEASED) {
            newButton = 2;
        }
        if (state & BUTTON3_PRESSED || state & BUTTON3_RELEASED) {
            newButton = 3;
        }

        /* threshold for double click, in milliseconds*/
        const bool elapsed = newTime - time > 300;

        if ((!elapsed && lastX >= 0 && lastY >= 0) && (std::abs(x - lastX) > 2 || std::abs(y - lastY) > 2)) {
            /* cursor traveled too far, reset state and convert back to a single click */
            this->Reset();
        }

        if (newButton != button || elapsed) {
            /* if the button changed or there was too much time between state
            changes, go ahead and reset now */
            Reset();
        }

        if (isDown) {
            /* to improve latency response we treat the leading edge of the first
            click as the event, and don't wait for a "release" event, because that
            can take hundreds of milliseconds. we kludge the `wasDown` flag to be
            false, so the subsequent click (below) can be "correctly" recorded
            as a double click. */
            if (!this->clicked) {
                this->clicked = true;
                this->wasDown = false;
            }
            else {
                this->wasDown = true;
            }
            result = true;
        }
        else if (clicked && wasDown && !isDown) {
            this->doubleClicked = true;
            this->wasDown = true;
            result = true;
        }

        this->button = newButton;
        this->time = newTime;
        this->lastX = x;
        this->lastY = y;
        return result;
    }